

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp-impl.inc.c
# Opt level: O0

void gen_qemu_st32fs(DisasContext_conflict10 *ctx,TCGv_i64 src,TCGv_i64 addr)

{
  TCGContext_conflict10 *tcg_ctx_00;
  TCGv_i32 retval;
  TCGv_i32 tmp;
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i64 addr_local;
  TCGv_i64 src_local;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  retval = tcg_temp_new_i32(tcg_ctx_00);
  gen_helper_tosingle(tcg_ctx_00,retval,src);
  tcg_gen_qemu_st_i32_ppc64
            (tcg_ctx_00,retval,addr,(long)ctx->mem_idx,ctx->default_tcg_memop_mask | MO_32);
  tcg_temp_free_i32(tcg_ctx_00,retval);
  return;
}

Assistant:

static void gen_qemu_st32fs(DisasContext *ctx, TCGv_i64 src, TCGv addr)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i32 tmp = tcg_temp_new_i32(tcg_ctx);
    gen_helper_tosingle(tcg_ctx, tmp, src);
    tcg_gen_qemu_st_i32(tcg_ctx, tmp, addr, ctx->mem_idx, DEF_MEMOP(MO_UL));
    tcg_temp_free_i32(tcg_ctx, tmp);
}